

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O2

void test_convert<long,double>(uint length,long value)

{
  _func_int ***ppp_Var1;
  long *__p;
  double *__p_00;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  long *local_48;
  shared_ptr<long> pt;
  shared_ptr<double> pu;
  
  __p = nosimd::common::malloc<long>(length);
  std::__shared_ptr<long,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<long,void(*)(long*),void>
            ((__shared_ptr<long,(__gnu_cxx::_Lock_policy)2> *)&local_48,__p,
             nosimd::common::free<long>);
  __p_00 = nosimd::common::malloc<double>(length);
  std::__shared_ptr<double,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<double,void(*)(double*),void>
            ((__shared_ptr<double,(__gnu_cxx::_Lock_policy)2> *)
             &pt.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p_00,
             nosimd::common::free<double>);
  nosimd::common::set<long>(value,local_48,length);
  nosimd::common::convert<long,double>
            (local_48,(double *)
                      pt.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar3 = 0;
  do {
    if (length == uVar3) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt);
      return;
    }
    ppp_Var1 = &(pt.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar3;
    dVar5 = (double)*ppp_Var1 - (double)value;
    uVar4 = -(ulong)(dVar5 < 0.0);
    uVar3 = uVar3 + 1;
  } while ((double)(~uVar4 & (ulong)dVar5 | (ulong)((double)value - (double)*ppp_Var1) & uVar4) <
           2.220446049250313e-16);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = "void test_convert(unsigned int, _T) [_T = long, _U = double]";
  *(undefined4 *)(puVar2 + 1) = 0x17;
  *(uint *)((long)puVar2 + 0xc) = length;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}